

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hh
# Opt level: O0

void __thiscall OptionIndentIncrement::OptionIndentIncrement(OptionIndentIncrement *this)

{
  OptionIndentIncrement *this_local;
  
  ArchOption::ArchOption(&this->super_ArchOption);
  (this->super_ArchOption)._vptr_ArchOption = (_func_int **)&PTR_apply_00849938;
  std::__cxx11::string::operator=((string *)&(this->super_ArchOption).name,"indentincrement");
  return;
}

Assistant:

OptionIndentIncrement(void) { name = "indentincrement"; }